

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  _GLFWjoystick *js_00;
  _GLFWjoystick *js;
  int local_2128;
  int code_1;
  int code;
  int hatCount;
  int buttonCount;
  int axisCount;
  char guid [33];
  char local_20e8;
  char local_20e7;
  char local_20e6;
  char local_20e5;
  char local_20e4;
  char local_20e3;
  char local_20e2;
  char local_20e1;
  char name [256];
  input_id id;
  char absBits [8];
  char keyBits [96];
  byte local_1f6c [4];
  int local_1f68;
  char evBits [4];
  _GLFWjoystickLinux linjs;
  int jid;
  char *path_local;
  
  linjs.hats[3][0] = 0;
  unique0x100005c3 = path;
  while( true ) {
    if (0xf < linjs.hats[3][0]) {
      memset(&local_1f68,0,0x1f24);
      local_1f68 = open(stack0xffffffffffffffc0,0x800);
      if (local_1f68 == -1) {
        path_local._4_4_ = 0;
      }
      else {
        memset(local_1f6c,0,4);
        memset(absBits,0,0x60);
        memset(&id,0,8);
        iVar1 = ioctl(local_1f68,0x80044520,local_1f6c);
        if ((((iVar1 < 0) || (iVar1 = ioctl(local_1f68,0x80604521,absBits), iVar1 < 0)) ||
            (iVar1 = ioctl(local_1f68,0x80084523,&id), iVar1 < 0)) ||
           (iVar1 = ioctl(local_1f68,0x80084502,name + 0xf8), iVar1 < 0)) {
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          _glfwInputError(0x10008,"Linux: Failed to query input device: %s",pcVar3);
          close(local_1f68);
          path_local._4_4_ = 0;
        }
        else if ((local_1f6c[0] & 8) == 0) {
          close(local_1f68);
          path_local._4_4_ = 0;
        }
        else {
          memset(&local_20e8,0,0x100);
          iVar1 = ioctl(local_1f68,0x81004506,&local_20e8);
          if (iVar1 < 0) {
            strncpy(&local_20e8,"Unknown",0x100);
          }
          memset(&buttonCount,0,0x21);
          if (((name._250_2_ == 0) || (name._252_2_ == 0)) || (name._254_2_ == 0)) {
            sprintf((char *)&buttonCount,
                    "%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                    (ulong)((ushort)name._248_2_ & 0xff),
                    (ulong)(uint)((int)(uint)(ushort)name._248_2_ >> 8),(ulong)(uint)(int)local_20e8
                    ,(ulong)(uint)(int)local_20e7,(int)local_20e6,(int)local_20e5,(int)local_20e4,
                    (int)local_20e3,(int)local_20e2,(int)local_20e1,(int)name[0],(int)name[1],
                    (int)name[2]);
          }
          else {
            sprintf((char *)&buttonCount,"%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                    (ulong)((ushort)name._248_2_ & 0xff),
                    (ulong)(uint)((int)(uint)(ushort)name._248_2_ >> 8),
                    (ulong)((ushort)name._250_2_ & 0xff),
                    (ulong)(uint)((int)(uint)(ushort)name._250_2_ >> 8),(ushort)name._252_2_ & 0xff,
                    (int)(uint)(ushort)name._252_2_ >> 8,(ushort)name._254_2_ & 0xff,
                    (int)(uint)(ushort)name._254_2_ >> 8);
          }
          hatCount = 0;
          code = 0;
          code_1 = 0;
          for (local_2128 = 0x100; local_2128 < 0x300; local_2128 = local_2128 + 1) {
            if (((int)absBits[local_2128 / 8] & 1 << ((byte)((long)local_2128 % 8) & 0x1f)) != 0) {
              linjs.keyMap[(long)(local_2128 + -0x100) + -2] = code;
              code = code + 1;
            }
          }
          for (js._4_4_ = 0; js._4_4_ < 0x40; js._4_4_ = js._4_4_ + 1) {
            linjs.absMap[(long)js._4_4_ + -2] = -1;
            if (((int)absBits[(long)(js._4_4_ / 8) + -8] & 1 << ((byte)((long)js._4_4_ % 8) & 0x1f))
                != 0) {
              if ((js._4_4_ < 0x10) || (0x17 < js._4_4_)) {
                iVar1 = ioctl(local_1f68,(ulong)(js._4_4_ + 0x40U | 0x80004500) | 0x180000,
                              &linjs.absInfo[(long)js._4_4_ + -1].flat);
                if (-1 < iVar1) {
                  linjs.absMap[(long)js._4_4_ + -2] = hatCount;
                  hatCount = hatCount + 1;
                }
              }
              else {
                linjs.absMap[(long)js._4_4_ + -2] = code_1;
                code_1 = code_1 + 1;
                js._4_4_ = js._4_4_ + 1;
              }
            }
          }
          js_00 = _glfwAllocJoystick(&local_20e8,(char *)&buttonCount,hatCount,code,code_1);
          if (js_00 == (_GLFWjoystick *)0x0) {
            close(local_1f68);
            path_local._4_4_ = 0;
          }
          else {
            strncpy(evBits,stack0xffffffffffffffc0,0xfff);
            memcpy(&js_00->linjs,&local_1f68,0x1f24);
            pollAbsState(js_00);
            _glfwInputJoystick(js_00,0x40001);
            path_local._4_4_ = 1;
          }
        }
      }
      return path_local._4_4_;
    }
    if ((_glfw.joysticks[linjs.hats[3][0]].connected != 0) &&
       (iVar1 = strcmp(_glfw.joysticks[linjs.hats[3][0]].linjs.path,stack0xffffffffffffffc0),
       iVar1 == 0)) break;
    linjs.hats[3][0] = linjs.hats[3][0] + 1;
  }
  return 0;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    for (int jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].connected)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    _GLFWjoystickLinux linjs = {0};
    linjs.fd = open(path, O_RDONLY | O_NONBLOCK);
    if (linjs.fd == -1)
        return GLFW_FALSE;

    char evBits[(EV_CNT + 7) / 8] = {0};
    char keyBits[(KEY_CNT + 7) / 8] = {0};
    char absBits[(ABS_CNT + 7) / 8] = {0};
    struct input_id id;

    if (ioctl(linjs.fd, EVIOCGBIT(0, sizeof(evBits)), evBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_KEY, sizeof(keyBits)), keyBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_ABS, sizeof(absBits)), absBits) < 0 ||
        ioctl(linjs.fd, EVIOCGID, &id) < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Linux: Failed to query input device: %s",
                        strerror(errno));
        close(linjs.fd);
        return GLFW_FALSE;
    }

    // Ensure this device supports the events expected of a joystick
    if (!isBitSet(EV_ABS, evBits))
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    char name[256] = "";

    if (ioctl(linjs.fd, EVIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    char guid[33] = "";

    // Generate a joystick GUID that matches the SDL 2.0.5+ one
    if (id.vendor && id.product && id.version)
    {
        sprintf(guid, "%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                id.bustype & 0xff, id.bustype >> 8,
                id.vendor & 0xff,  id.vendor >> 8,
                id.product & 0xff, id.product >> 8,
                id.version & 0xff, id.version >> 8);
    }
    else
    {
        sprintf(guid, "%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                id.bustype & 0xff, id.bustype >> 8,
                name[0], name[1], name[2], name[3],
                name[4], name[5], name[6], name[7],
                name[8], name[9], name[10]);
    }

    int axisCount = 0, buttonCount = 0, hatCount = 0;

    for (int code = BTN_MISC;  code < KEY_CNT;  code++)
    {
        if (!isBitSet(code, keyBits))
            continue;

        linjs.keyMap[code - BTN_MISC] = buttonCount;
        buttonCount++;
    }

    for (int code = 0;  code < ABS_CNT;  code++)
    {
        linjs.absMap[code] = -1;
        if (!isBitSet(code, absBits))
            continue;

        if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
        {
            linjs.absMap[code] = hatCount;
            hatCount++;
            // Skip the Y axis
            code++;
        }
        else
        {
            if (ioctl(linjs.fd, EVIOCGABS(code), &linjs.absInfo[code]) < 0)
                continue;

            linjs.absMap[code] = axisCount;
            axisCount++;
        }
    }

    _GLFWjoystick* js =
        _glfwAllocJoystick(name, guid, axisCount, buttonCount, hatCount);
    if (!js)
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    strncpy(linjs.path, path, sizeof(linjs.path) - 1);
    memcpy(&js->linjs, &linjs, sizeof(linjs));

    pollAbsState(js);

    _glfwInputJoystick(js, GLFW_CONNECTED);
    return GLFW_TRUE;
}